

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.hpp
# Opt level: O0

MPI_Request * __thiscall mxx::requests::add(requests *this)

{
  reference ppoVar1;
  value_type local_18;
  requests *local_10;
  requests *this_local;
  
  local_18 = (value_type)0x0;
  local_10 = this;
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::push_back
            (&this->m_requests,&local_18);
  ppoVar1 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::back
                      (&this->m_requests);
  return ppoVar1;
}

Assistant:

MPI_Request& add() {
        m_requests.push_back(MPI_Request());
        return m_requests.back();
    }